

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O3

bool __thiscall trun::TestFunc::IsGlobalMain(TestFunc *this)

{
  size_t __n;
  int iVar1;
  Config *pCVar2;
  
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&this->moduleName,"-");
  if (iVar1 == 0) {
    pCVar2 = Config::Instance();
    __n = (this->caseName)._M_string_length;
    if (__n == (pCVar2->mainFuncName)._M_string_length) {
      if (__n != 0) {
        iVar1 = bcmp((this->caseName)._M_dataplus._M_p,(pCVar2->mainFuncName)._M_dataplus._M_p,__n);
        return iVar1 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool TestFunc::IsGlobalMain() {
    return (IsGlobal() && (caseName == Config::Instance().mainFuncName));
}